

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O1

Parser * Omega_h::accept_parser(Parser *__return_storage_ptr__,ParserInProgress *pip)

{
  __uniq_ptr_data<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>,_true,_true>
  _Var1;
  bool bVar2;
  pointer puVar3;
  Action AVar4;
  int iVar5;
  Action *pAVar6;
  long lVar7;
  GrammarPtr local_48;
  Action *local_38;
  
  local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pip->grammar).super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (pip->grammar).super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Parser::Parser(__return_storage_ptr__,&local_48,
                 (int)((ulong)((long)(pip->states).
                                     super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pip->states).
                                    super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3));
  if (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (0 < (int)((ulong)((long)(pip->states).
                              super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pip->states).
                             super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    iVar5 = 0;
    do {
      add_state(__return_storage_ptr__);
      iVar5 = iVar5 + 1;
    } while (iVar5 < (int)((ulong)((long)(pip->states).
                                         super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pip->states).
                                        super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  puVar3 = (pip->states).
           super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pip->states).
                              super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 3)) {
    lVar7 = 0;
    do {
      _Var1.
      super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
      ._M_t.
      super__Tuple_impl<0UL,_Omega_h::StateInProgress_*,_std::default_delete<Omega_h::StateInProgress>_>
      .super__Head_base<0UL,_Omega_h::StateInProgress_*,_false>._M_head_impl =
           puVar3[lVar7]._M_t.
           super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
      ;
      pAVar6 = *(Action **)
                ((long)_Var1.
                       super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Omega_h::StateInProgress_*,_std::default_delete<Omega_h::StateInProgress>_>
                       .super__Head_base<0UL,_Omega_h::StateInProgress_*,_false>._M_head_impl + 0x18
                );
      local_38 = *(Action **)
                  ((long)_Var1.
                         super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Omega_h::StateInProgress_*,_std::default_delete<Omega_h::StateInProgress>_>
                         .super__Head_base<0UL,_Omega_h::StateInProgress_*,_false>._M_head_impl +
                  0x20);
      if (pAVar6 != local_38) {
        do {
          if ((pAVar6->kind == ACTION_SHIFT) &&
             (bVar2 = is_nonterminal((pip->grammar).
                                     super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,*(int *)((long)pAVar6[4] + 0x20)), bVar2)) {
            iVar5 = as_nonterminal((pip->grammar).
                                   super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,*(int *)((long)pAVar6[4] + 0x20));
            add_nonterminal_action
                      (__return_storage_ptr__,(int)lVar7,iVar5,(pAVar6->field_1).production);
          }
          else {
            for (AVar4 = pAVar6[4]; AVar4 != (Action)(pAVar6 + 2);
                AVar4 = (Action)std::_Rb_tree_increment((_Rb_tree_node_base *)AVar4)) {
              iVar5 = *(int *)((long)AVar4 + 0x20);
              bVar2 = is_terminal((pip->grammar).
                                  super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,iVar5);
              if (!bVar2) {
                fail("assertion %s failed at %s +%d\n","is_terminal(*grammar, terminal)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
                     ,0x465);
              }
              add_terminal_action(__return_storage_ptr__,(int)lVar7,iVar5,*pAVar6);
            }
          }
          pAVar6 = pAVar6 + 7;
        } while (pAVar6 != local_38);
      }
      lVar7 = lVar7 + 1;
      puVar3 = (pip->states).
               super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(pip->states).
                                         super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)
                          >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

Parser accept_parser(ParserInProgress const& pip) {
  auto& sips = pip.states;
  auto& grammar = pip.grammar;
  auto out = Parser(grammar, size(sips));
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    add_state(out);
  }
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    auto& sip = *at(sips, s_i);
    for (auto& action : sip.actions) {
      if (action.action.kind == ACTION_SHIFT &&
          is_nonterminal(*grammar, *(action.context.begin()))) {
        auto nt = as_nonterminal(*grammar, *(action.context.begin()));
        add_nonterminal_action(out, s_i, nt, action.action.next_state);
      } else {
        for (auto terminal : action.context) {
          OMEGA_H_CHECK(is_terminal(*grammar, terminal));
          add_terminal_action(out, s_i, terminal, action.action);
        }
      }
    }
  }
  return out;
}